

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O3

int conn_upkeep(Curl_easy *data,connectdata *conn,void *param)

{
  if (conn->handler->connection_check != (_func_uint_Curl_easy_ptr_connectdata_ptr_uint *)0x0) {
    Curl_attach_connection(data,conn);
    (*conn->handler->connection_check)(data,conn,2);
    Curl_detach_connection(data);
  }
  return 0;
}

Assistant:

static int conn_upkeep(struct Curl_easy *data,
                       struct connectdata *conn,
                       void *param)
{
  /* Param is unused. */
  (void)param;

  if(conn->handler->connection_check) {
    /* briefly attach the connection to this transfer for the purpose of
       checking it */
    Curl_attach_connection(data, conn);

    /* Do a protocol-specific keepalive check on the connection. */
    conn->handler->connection_check(data, conn, CONNCHECK_KEEPALIVE);
    /* detach the connection again */
    Curl_detach_connection(data);
  }

  return 0; /* continue iteration */
}